

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O3

void __thiscall
rlottie::Animation::setValue(undefined4 param_1,Animation *this,Property param_3,string *param_4)

{
  undefined1 local_48 [32];
  code *local_28;
  undefined8 local_20;
  undefined4 local_18;
  
  local_18 = 0;
  local_20 = 0;
  local_48._4_4_ = Value;
  local_28 = std::
             _Function_handler<float_(const_rlottie::FrameInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Samsung[P]rlottie/src/lottie/lottieanimation.cpp:395:34)>
             ::_M_invoke;
  local_48._20_4_ = 0;
  local_48._12_8_ = 0;
  local_48._24_8_ =
       std::
       _Function_handler<float_(const_rlottie::FrameInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Samsung[P]rlottie/src/lottie/lottieanimation.cpp:395:34)>
       ::_M_manager;
  local_48._0_4_ = param_3;
  local_48._8_4_ = param_1;
  if (param_4->_M_string_length != 0) {
    internal::renderer::Composition::setValue
              ((Composition *)
               (((this->d)._M_t.
                 super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t.
                 super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
                 super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl)->mRenderer)._M_t,
               param_4,(LOTVariant *)local_48);
  }
  LOTVariant::Destroy((LOTVariant *)local_48);
  return;
}

Assistant:

void Animation::setValue(Float_Type, Property prop, const std::string &keypath,
                         float value)
{
    d->setValue(keypath,
                LOTVariant(prop, [value](const FrameInfo &) { return value; }));
}